

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMultiMap<QString,_QString>::insert(QMultiMap<QString,_QString> *this,QString *key,QString *value)

{
  bool bVar1;
  QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
  *pQVar2;
  pair<const_QString,_QString> *in_RDI;
  long in_FS_OFFSET;
  iterator i;
  QMultiMap<QString,_QString> copy;
  multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
  *in_stack_ffffffffffffff68;
  iterator it;
  QMultiMap<QString,_QString> *in_stack_ffffffffffffff70;
  pair<const_QString,_QString> *this_00;
  QString *in_stack_ffffffffffffff78;
  const_iterator in_stack_ffffffffffffff88;
  pair<const_QString,_QString> local_58;
  _Rb_tree_const_iterator<std::pair<const_QString,_QString>_> local_28;
  iterator local_20;
  undefined8 local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff70->d);
  if (bVar1) {
    QMultiMap(in_stack_ffffffffffffff70,(QMultiMap<QString,_QString> *)in_stack_ffffffffffffff68);
  }
  else {
    memset(&local_18,0,8);
    QMultiMap((QMultiMap<QString,_QString> *)0x149e94);
  }
  detach(in_stack_ffffffffffffff70);
  local_20._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                *)0x149eb7);
  local_20._M_node =
       (_Base_ptr)
       std::
       multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
       ::lower_bound(in_stack_ffffffffffffff68,(key_type *)0x149ec8);
  pQVar2 = QtPrivate::
           QExplicitlySharedDataPointerV2<QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
           ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                         *)0x149ed7);
  it._M_node = (_Base_ptr)&pQVar2->m;
  std::_Rb_tree_const_iterator<std::pair<const_QString,_QString>_>::_Rb_tree_const_iterator
            (&local_28,&local_20);
  this_00 = &local_58;
  std::pair<const_QString,_QString>::pair<const_QString,_QString,_true>
            (in_RDI,in_stack_ffffffffffffff78,&this_00->first);
  std::
  multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
  ::insert((multimap<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
            *)this_00,in_stack_ffffffffffffff88,(value_type *)it._M_node);
  iterator::iterator((iterator *)0x149f31,it);
  std::pair<const_QString,_QString>::~pair(this_00);
  ~QMultiMap((QMultiMap<QString,_QString> *)0x149f48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }